

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionParser.cpp
# Opt level: O2

unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>
relationalExpression(Tokenizer *tokenizer)

{
  unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_> __p;
  Token *pTVar1;
  Tokenizer *in_RSI;
  OperatorType op;
  unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_> exp;
  unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_> exp2;
  undefined1 local_54 [4];
  undefined1 local_50 [16];
  _Head_base<0UL,_ExpressionInternal_*,_false> local_40;
  unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_> local_38;
  
  shiftExpression((Tokenizer *)local_50);
  if ((ExpressionInternal *)local_50._0_8_ == (ExpressionInternal *)0x0) {
    (tokenizer->tokens).super__List_base<Token,_std::allocator<Token>_>._M_impl._M_node.
    super__List_node_base._M_next = (_List_node_base *)0x0;
  }
  else {
    local_40._M_head_impl = (ExpressionInternal *)tokenizer;
    while( true ) {
      local_54 = (undefined1  [4])0x0;
      pTVar1 = Tokenizer::peekToken(in_RSI,0);
      switch(pTVar1->type) {
      case Less:
        local_54 = (undefined1  [4])0x10;
        break;
      case Greater:
        local_54 = (undefined1  [4])0x11;
        break;
      case LessEqual:
        local_54 = (undefined1  [4])0x12;
        break;
      case GreaterEqual:
        local_54 = (undefined1  [4])0x13;
        break;
      default:
        if (local_54 == (undefined1  [4])0x0) {
          *(undefined8 *)local_40._M_head_impl = local_50._0_8_;
          local_50._0_8_ = (ExpressionInternal *)0x0;
          tokenizer = (Tokenizer *)local_40._M_head_impl;
          goto LAB_0013e06a;
        }
      }
      Tokenizer::eatToken(in_RSI);
      shiftExpression((Tokenizer *)(local_50 + 8));
      tokenizer = (Tokenizer *)local_40;
      if ((_List_node_base *)local_50._8_8_ == (_List_node_base *)0x0) break;
      std::
      make_unique<ExpressionInternal,OperatorType&,std::unique_ptr<ExpressionInternal,std::default_delete<ExpressionInternal>>,std::unique_ptr<ExpressionInternal,std::default_delete<ExpressionInternal>>>
                ((OperatorType *)&local_38,
                 (unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_> *)
                 local_54,(unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>
                           *)local_50);
      __p._M_t.super___uniq_ptr_impl<ExpressionInternal,_std::default_delete<ExpressionInternal>_>.
      _M_t.super__Tuple_impl<0UL,_ExpressionInternal_*,_std::default_delete<ExpressionInternal>_>.
      super__Head_base<0UL,_ExpressionInternal_*,_false>._M_head_impl =
           local_38._M_t.
           super___uniq_ptr_impl<ExpressionInternal,_std::default_delete<ExpressionInternal>_>._M_t.
           super__Tuple_impl<0UL,_ExpressionInternal_*,_std::default_delete<ExpressionInternal>_>.
           super__Head_base<0UL,_ExpressionInternal_*,_false>._M_head_impl;
      local_38._M_t.
      super___uniq_ptr_impl<ExpressionInternal,_std::default_delete<ExpressionInternal>_>._M_t.
      super__Tuple_impl<0UL,_ExpressionInternal_*,_std::default_delete<ExpressionInternal>_>.
      super__Head_base<0UL,_ExpressionInternal_*,_false>._M_head_impl =
           (__uniq_ptr_data<ExpressionInternal,_std::default_delete<ExpressionInternal>,_true,_true>
           )(__uniq_ptr_impl<ExpressionInternal,_std::default_delete<ExpressionInternal>_>)0x0;
      std::__uniq_ptr_impl<ExpressionInternal,_std::default_delete<ExpressionInternal>_>::reset
                ((__uniq_ptr_impl<ExpressionInternal,_std::default_delete<ExpressionInternal>_> *)
                 local_50,(pointer)__p._M_t.
                                   super___uniq_ptr_impl<ExpressionInternal,_std::default_delete<ExpressionInternal>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_ExpressionInternal_*,_std::default_delete<ExpressionInternal>_>
                                   .super__Head_base<0UL,_ExpressionInternal_*,_false>._M_head_impl)
      ;
      std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>::~unique_ptr
                (&local_38);
      std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>::~unique_ptr
                ((unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_> *)
                 (local_50 + 8));
    }
    *(undefined8 *)local_40._M_head_impl = 0;
    std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>::~unique_ptr
              ((unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_> *)
               (local_50 + 8));
  }
LAB_0013e06a:
  std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>::~unique_ptr
            ((unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_> *)local_50);
  return (__uniq_ptr_data<ExpressionInternal,_std::default_delete<ExpressionInternal>,_true,_true>)
         (tuple<ExpressionInternal_*,_std::default_delete<ExpressionInternal>_>)tokenizer;
}

Assistant:

static std::unique_ptr<ExpressionInternal> relationalExpression(Tokenizer& tokenizer)
{
	std::unique_ptr<ExpressionInternal> exp = shiftExpression(tokenizer);
	if (exp == nullptr)
		return nullptr;

	while (true)
	{
		OperatorType op = OperatorType::Invalid;
		switch (tokenizer.peekToken().type)
		{
		case TokenType::Less:
			op = OperatorType::Less;
			break;
		case TokenType::LessEqual:
			op = OperatorType::LessEqual;
			break;
		case TokenType::Greater:
			op = OperatorType::Greater;
			break;
		case TokenType::GreaterEqual:
			op = OperatorType::GreaterEqual;
			break;
		default:
			break;
		}

		if (op == OperatorType::Invalid)
			break;

		tokenizer.eatToken();

		std::unique_ptr<ExpressionInternal> exp2 = shiftExpression(tokenizer);
		if (exp2 == nullptr)
			return nullptr;
		exp = std::make_unique<ExpressionInternal>(op, std::move(exp), std::move(exp2));
	}

	return exp;
}